

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O2

void __thiscall Minisat::Solver::toDimacs(Solver *this,FILE *f,vec<Minisat::Lit,_int> *assumps)

{
  uint uVar1;
  FILE *f_00;
  bool bVar2;
  Var_conflict VVar3;
  ulong uVar4;
  char *pcVar5;
  int i;
  long lVar6;
  int i_1;
  int iVar7;
  int i_3;
  int j;
  uint *puVar8;
  lbool local_59;
  Var_conflict max;
  uint local_54;
  FILE *local_50;
  vec<int,_int> map;
  
  if (this->ok != false) {
    max = 0;
    map.data = (int *)0x0;
    map.sz = 0;
    map.cap = 0;
    iVar7 = 0;
    for (lVar6 = 0; uVar4 = (ulong)(this->clauses).sz, lVar6 < (long)uVar4; lVar6 = lVar6 + 1) {
      bVar2 = satisfied(this,(Clause *)((this->ca).ra.memory + (this->clauses).data[lVar6]));
      iVar7 = iVar7 + (uint)!bVar2;
    }
    local_54 = iVar7;
    local_50 = (FILE *)f;
    for (lVar6 = 0; lVar6 < (int)uVar4; lVar6 = lVar6 + 1) {
      bVar2 = satisfied(this,(Clause *)((this->ca).ra.memory + (this->clauses).data[lVar6]));
      if (!bVar2) {
        puVar8 = (this->ca).ra.memory + (this->clauses).data[lVar6];
        for (uVar4 = 0; uVar4 < *puVar8 >> 5; uVar4 = uVar4 + 1) {
          local_59.value =
               (byte)puVar8[uVar4 + 1] & 1 ^
               (this->assigns).super_IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>.map.
               data[(int)puVar8[uVar4 + 1] >> 1].value;
          bVar2 = lbool::operator!=(&local_59,l_False);
          if (bVar2) {
            mapVar((int)puVar8[uVar4 + 1] >> 1,&map,&max);
          }
        }
      }
      uVar4 = (ulong)(uint)(this->clauses).sz;
    }
    local_54 = local_54 + assumps->sz;
    fprintf(local_50,"p cnf %d %d\n",(ulong)(uint)max);
    for (lVar6 = 0; f_00 = local_50, lVar6 < assumps->sz; lVar6 = lVar6 + 1) {
      uVar1 = assumps->data[lVar6].x;
      VVar3 = mapVar((int)uVar1 >> 1,&map,&max);
      pcVar5 = "-";
      if ((uVar1 & 1) == 0) {
        pcVar5 = "";
      }
      fprintf(local_50,"%s%d 0\n",pcVar5,(ulong)(VVar3 + 1));
    }
    for (lVar6 = 0; lVar6 < (this->clauses).sz; lVar6 = lVar6 + 1) {
      toDimacs(this,(FILE *)f_00,(Clause *)((this->ca).ra.memory + (this->clauses).data[lVar6]),&map
               ,&max);
    }
    if (0 < this->verbosity) {
      printf("Wrote DIMACS with %d variables and %d clauses.\n",(ulong)(uint)max,(ulong)local_54);
    }
    vec<int,_int>::~vec(&map);
    return;
  }
  fwrite("p cnf 1 2\n1 0\n-1 0\n",0x13,1,(FILE *)f);
  return;
}

Assistant:

void Solver::toDimacs(FILE* f, const vec<Lit>& assumps)
{
    // Handle case when solver is in contradictory state:
    if (!ok){
        fprintf(f, "p cnf 1 2\n1 0\n-1 0\n");
        return; }

    vec<Var> map; Var max = 0;

    // Cannot use removeClauses here because it is not safe
    // to deallocate them at this point. Could be improved.
    int cnt = 0;
    for (int i = 0; i < clauses.size(); i++)
        if (!satisfied(ca[clauses[i]]))
            cnt++;
        
    for (int i = 0; i < clauses.size(); i++)
        if (!satisfied(ca[clauses[i]])){
            Clause& c = ca[clauses[i]];
            for (int j = 0; j < c.size(); j++)
                if (value(c[j]) != l_False)
                    mapVar(var(c[j]), map, max);
        }

    // Assumptions are added as unit clauses:
    cnt += assumps.size();

    fprintf(f, "p cnf %d %d\n", max, cnt);

    for (int i = 0; i < assumps.size(); i++){
        assert(value(assumps[i]) != l_False);
        fprintf(f, "%s%d 0\n", sign(assumps[i]) ? "-" : "", mapVar(var(assumps[i]), map, max)+1);
    }

    for (int i = 0; i < clauses.size(); i++)
        toDimacs(f, ca[clauses[i]], map, max);

    if (verbosity > 0)
        printf("Wrote DIMACS with %d variables and %d clauses.\n", max, cnt);
}